

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O2

void __thiscall PeleLM::initDataOtherTypes(PeleLM *this)

{
  Real time;
  
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            ((FabArray<amrex::FArrayBox> *)
             (this->super_NavierStokesBase).super_AmrLevel.state.
             super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
             super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
             super__Vector_impl_data._M_start[RhoYdot_Type].new_data._M_t.
             super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,0.0);
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            ((FabArray<amrex::FArrayBox> *)
             (this->super_NavierStokesBase).super_AmrLevel.state.
             super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
             super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
             super__Vector_impl_data._M_start[FuncCount_Type].new_data._M_t.
             super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,1.0);
  time = amrex::StateData::curTime
                   ((this->super_NavierStokesBase).super_AmrLevel.state.
                    super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                    super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
                    super__Vector_impl_data._M_start);
  setThermoPress(this,time);
  return;
}

Assistant:

void
PeleLM::initDataOtherTypes ()
{
  // Set initial omegadot = 0
  get_new_data(RhoYdot_Type).setVal(0.0);

  // Put something reasonable into the FuncCount variable
  get_new_data(FuncCount_Type).setVal(1);

  // Fill the thermodynamic pressure into the state
  setThermoPress(state[State_Type].curTime());
}